

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O1

void __thiscall net_uv::KCPServer::onIdleRun(KCPServer *this)

{
  ServerStage SVar1;
  _Rb_tree_node_base *p_Var2;
  
  (*(this->super_Server).super_Runnable._vptr_Runnable[0x11])();
  SVar1 = (this->super_Server).m_serverStage;
  if (SVar1 == WAIT_SESSION_CLOSE) {
    if ((this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      (**(this->m_server->super_Socket)._vptr_Socket)();
      free(this->m_server);
      this->m_server = (KCPSocket *)0x0;
      Runnable::stopIdle((Runnable *)this);
      UVLoop::stop(&(this->super_Server).super_Runnable.m_loop);
      return;
    }
  }
  else if (SVar1 == CLEAR) {
    for (p_Var2 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->m_allSession)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (*(char *)&p_Var2[1]._M_left == '\0') {
        (**(code **)(*(long *)p_Var2[1]._M_parent + 0x48))();
      }
    }
    (this->super_Server).m_serverStage = WAIT_SESSION_CLOSE;
  }
  return;
}

Assistant:

void KCPServer::onIdleRun()
{
	executeOperation();

	switch (m_serverStage)
	{
	case ServerStage::CLEAR:
	{
		for (auto& it : m_allSession)
		{
			if (!it.second.isInvalid)
			{
				it.second.session->executeDisconnect();
			}
		}
		m_serverStage = ServerStage::WAIT_SESSION_CLOSE;
	}
	break;
	case ServerStage::WAIT_SESSION_CLOSE:
	{
		if (m_allSession.empty())
		{
			m_server->~KCPSocket();
			fc_free(m_server);
			m_server = NULL;

			stopIdle();
			m_loop.stop();
		}
	}
	break;
	default:
		break;
	}
}